

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::ConcatTransform(ParsedScene *this,Float *tr,FileLoc loc)

{
  Float (*paFVar1) [4];
  ulong uVar2;
  Transform *this_00;
  undefined1 (*pauVar3) [16];
  Transform *pTVar4;
  int i;
  long lVar5;
  uint i_00;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  SquareMatrix<4> r_1;
  Transform local_2f8;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  Float local_238 [2];
  Float aFStack_230 [2];
  Float aFStack_228 [2];
  Float aFStack_220 [2];
  Float aFStack_218 [2];
  Float aFStack_210 [2];
  Float aFStack_208 [2];
  Float aFStack_200 [2];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [64];
  SquareMatrix<4> local_178;
  Transform local_138;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    paFVar1 = local_2f8.m.m + 1;
    local_2f8.m.m[0][2] = 0.0;
    local_2f8.m.m[0][3] = 0.0;
    local_2f8.m.m[1][0]._0_1_ = 0;
    local_2f8.m.m[0]._0_8_ = paFVar1;
    detail::stringPrintfRecursive<char_const(&)[16]>
              ((string *)&local_2f8,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"ConcatTransform");
    Error(&loc,(char *)local_2f8.m.m[0]._0_8_);
    if ((Float (*) [4])local_2f8.m.m[0]._0_8_ != paFVar1) {
      operator_delete((void *)local_2f8.m.m[0]._0_8_,
                      CONCAT71(local_2f8.m.m[1]._1_7_,local_2f8.m.m[1][0]._0_1_) + 1);
    }
  }
  else {
    auVar10 = vpbroadcastq_avx512f();
    auVar11 = vpaddq_avx512f(auVar10,_DAT_004b92c0);
    local_1b8 = vmovdqu64_avx512f(auVar11);
    auVar10 = vpaddq_avx512f(auVar10,_DAT_004b9300);
    local_1f8 = vmovdqu64_avx512f(auVar10);
    auVar7 = vpbroadcastq_avx512vl();
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x30201000));
    local_258 = vpaddq_avx2(auVar7,auVar9);
    auVar7 = vpbroadcastq_avx512vl();
    local_278 = vpaddq_avx2(auVar7,auVar9);
    i_00 = 0;
    do {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        this_00 = TransformSet::operator[](&this->curTransform,i_00);
        vscatterqps_avx512f(ZEXT864(0) + local_1f8,0xffff,*(undefined1 (*) [32])tr);
        vscatterqps_avx512f(ZEXT864(0) + local_1b8,0xffff,*(undefined1 (*) [32])(tr + 8));
        pbrt::Transform::Transform(&local_b0,&local_178);
        auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        lVar5 = 0;
        pTVar4 = &local_2f8;
        do {
          auVar7 = vpbroadcastq_avx512vl();
          uVar2 = vpcmpeqq_avx512vl(auVar7,auVar9);
          auVar12 = vpmovm2d_avx512vl(uVar2 & 0xf);
          auVar12 = vpsrld_avx(auVar12,0x1f);
          auVar12 = vcvtdq2ps_avx(auVar12);
          *(undefined1 (*) [16])pTVar4 = auVar12;
          auVar7 = local_258;
          lVar5 = lVar5 + 1;
          pTVar4 = (Transform *)((long)pTVar4 + 0x10);
        } while (lVar5 != 4);
        lVar5 = 0;
        pTVar4 = &local_2f8;
        do {
          auVar8 = vpbroadcastq_avx512vl();
          auVar8 = vpsllq_avx2(auVar8,2);
          vpaddq_avx2(auVar7,auVar8);
          auVar12 = vgatherqps_avx512vl(*(undefined8 *)*(undefined1 (*) [16])pTVar4);
          *(undefined1 (*) [16])pTVar4 = auVar12;
          lVar5 = lVar5 + 1;
          pTVar4 = (Transform *)((long)pTVar4 + 0x10);
        } while (lVar5 != 4);
        pauVar3 = (undefined1 (*) [16])local_238;
        lVar5 = 0;
        do {
          auVar7 = vpbroadcastq_avx512vl();
          uVar2 = vpcmpeqq_avx512vl(auVar7,auVar9);
          auVar12 = vpmovm2d_avx512vl(uVar2 & 0xf);
          auVar12 = vpsrld_avx(auVar12,0x1f);
          auVar12 = vcvtdq2ps_avx(auVar12);
          *pauVar3 = auVar12;
          lVar5 = lVar5 + 1;
          pauVar3 = pauVar3 + 1;
        } while (lVar5 != 4);
        pauVar3 = (undefined1 (*) [16])local_238;
        lVar5 = 0;
        do {
          auVar9 = vpbroadcastq_avx512vl();
          auVar9 = vpsllq_avx2(auVar9,2);
          vpaddq_avx2(local_278,auVar9);
          auVar12 = vgatherqps_avx512vl(*(undefined8 *)*pauVar3);
          *pauVar3 = auVar12;
          lVar5 = lVar5 + 1;
          pauVar3 = pauVar3 + 1;
        } while (lVar5 != 4);
        local_138.m.m[0][0] = local_2f8.m.m[0][0];
        local_138.m.m[0][1] = local_2f8.m.m[0][1];
        local_138.m.m[0][2] = local_2f8.m.m[0][2];
        local_138.m.m[0][3] = local_2f8.m.m[0][3];
        local_138.m.m[1][2] = local_2f8.m.m[1][2];
        local_138.m.m[1][3] = local_2f8.m.m[1][3];
        local_138.m.m[2][0] = local_2f8.m.m[2][0];
        local_138.m.m[2][1] = local_2f8.m.m[2][1];
        local_138.m.m[2][2] = local_2f8.m.m[2][2];
        local_138.m.m[2][3] = local_2f8.m.m[2][3];
        local_138.m.m[3][0] = local_2f8.m.m[3][0];
        local_138.m.m[3][1] = local_2f8.m.m[3][1];
        local_138.m.m[3][2] = local_2f8.m.m[3][2];
        local_138.m.m[3][3] = local_2f8.m.m[3][3];
        local_138.mInv.m[0][0] = local_238[0];
        local_138.mInv.m[0][1] = local_238[1];
        local_138.mInv.m[0][2] = aFStack_230[0];
        local_138.mInv.m[0][3] = aFStack_230[1];
        local_138.mInv.m[1][0] = aFStack_228[0];
        local_138.mInv.m[1][1] = aFStack_228[1];
        local_138.mInv.m[1][2] = aFStack_220[0];
        local_138.mInv.m[1][3] = aFStack_220[1];
        local_138.mInv.m[2][0] = aFStack_218[0];
        local_138.mInv.m[2][1] = aFStack_218[1];
        local_138.mInv.m[2][2] = aFStack_210[0];
        local_138.mInv.m[2][3] = aFStack_210[1];
        local_138.mInv.m[3][0] = aFStack_208[0];
        local_138.mInv.m[3][1] = aFStack_208[1];
        local_138.mInv.m[3][2] = aFStack_200[0];
        local_138.mInv.m[3][3] = aFStack_200[1];
        pbrt::Transform::operator*(&local_2f8,this_00,&local_138);
        pTVar4 = TransformSet::operator[](&this->curTransform,i_00);
        auVar10._8_4_ = local_2f8.m.m[0][2];
        auVar10._12_4_ = local_2f8.m.m[0][3];
        auVar10._0_4_ = local_2f8.m.m[0][0];
        auVar10._4_4_ = local_2f8.m.m[0][1];
        auVar10[0x10] = local_2f8.m.m[1][0]._0_1_;
        auVar10._17_7_ = local_2f8.m.m[1]._1_7_;
        auVar10._24_4_ = local_2f8.m.m[1][2];
        auVar10._28_4_ = local_2f8.m.m[1][3];
        auVar10._32_4_ = local_2f8.m.m[2][0];
        auVar10._36_4_ = local_2f8.m.m[2][1];
        auVar10._40_4_ = local_2f8.m.m[2][2];
        auVar10._44_4_ = local_2f8.m.m[2][3];
        auVar10._48_4_ = local_2f8.m.m[3][0];
        auVar10._52_4_ = local_2f8.m.m[3][1];
        auVar10._56_4_ = local_2f8.m.m[3][2];
        auVar10._60_4_ = local_2f8.m.m[3][3];
        auVar10 = vmovdqu64_avx512f(auVar10);
        auVar11 = vmovdqu64_avx512f((undefined1  [64])local_2f8.mInv.m);
        auVar10 = vmovdqu64_avx512f(auVar10);
        *(undefined1 (*) [64])(pTVar4->m).m = auVar10;
        auVar10 = vmovdqu64_avx512f(auVar11);
        *(undefined1 (*) [64])(pTVar4->mInv).m = auVar10;
      }
      bVar6 = i_00 == 0;
      i_00 = i_00 + 1;
    } while (bVar6);
  }
  return;
}

Assistant:

void ParsedScene::ConcatTransform(Float tr[16], FileLoc loc) {
    VERIFY_INITIALIZED("ConcatTransform");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * Transpose(pbrt::Transform(SquareMatrix<4>(
                                                    pstd::MakeSpan(tr, 16))));)
}